

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

pair<double,_unsigned_long> units::getPrefixMultiplierWord(string *unit)

{
  char *__s1;
  int iVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  tuple<const_char_*,_double,_int> *ptVar4;
  __tuple_element_t<0UL,_tuple<const_char_*,_double,_int>_> *ppcVar5;
  char *__s2;
  __tuple_element_t<2UL,_tuple<const_char_*,_double,_int>_> *p_Var6;
  __tuple_element_t<1UL,_tuple<const_char_*,_double,_int>_> *__x;
  int local_44;
  double local_40 [2];
  undefined8 local_30;
  tuple<const_char_*,_double,_int> *local_28;
  tuple<const_char_*,_double,_int> *res;
  string *unit_local;
  
  res = (tuple<const_char_*,_double,_int> *)unit;
  pvVar2 = std::array<std::tuple<const_char_*,_double,_int>,_36UL>::begin
                     ((array<std::tuple<const_char_*,_double,_int>,_36UL> *)prefixWords);
  pvVar3 = std::array<std::tuple<const_char_*,_double,_int>,_36UL>::end
                     ((array<std::tuple<const_char_*,_double,_int>,_36UL> *)prefixWords);
  local_30 = std::__cxx11::string::c_str();
  ptVar4 = std::
           lower_bound<std::tuple<char_const*,double,int>const*,char_const*,units::getPrefixMultiplierWord(std::__cxx11::string_const&)::__0>
                     (pvVar2,pvVar3,&local_30);
  local_28 = ptVar4;
  pvVar2 = std::array<std::tuple<const_char_*,_double,_int>,_36UL>::end
                     ((array<std::tuple<const_char_*,_double,_int>,_36UL> *)prefixWords);
  if (ptVar4 != pvVar2) {
    ppcVar5 = std::get<0ul,char_const*,double,int>(local_28);
    __s1 = *ppcVar5;
    __s2 = (char *)std::__cxx11::string::c_str();
    p_Var6 = std::get<2ul,char_const*,double,int>(local_28);
    iVar1 = strncmp(__s1,__s2,(long)*p_Var6);
    if (iVar1 == 0) {
      __x = std::get<1ul,char_const*,double,int>(local_28);
      p_Var6 = std::get<2ul,char_const*,double,int>(local_28);
      std::pair<double,_unsigned_long>::pair<const_int_&,_true>
                ((pair<double,_unsigned_long> *)&unit_local,__x,p_Var6);
      return _unit_local;
    }
  }
  local_40[0] = 0.0;
  local_44 = 0;
  std::pair<double,_unsigned_long>::pair<double,_int,_true>
            ((pair<double,_unsigned_long> *)&unit_local,local_40,&local_44);
  return _unit_local;
}

Assistant:

static std::pair<double, size_t>
    getPrefixMultiplierWord(const std::string& unit)
{
    // NOLINTNEXTLINE (readability-qualified-auto)
    auto res = std::lower_bound(
        prefixWords.begin(),
        prefixWords.end(),
        unit.c_str(),
        [](const utup& prefix, const char* val) {
            return (strncmp(std::get<0>(prefix), val, std::get<2>(prefix)) < 0);
        });
    if (res != prefixWords.end()) {
        if (strncmp(std::get<0>(*res), unit.c_str(), std::get<2>(*res)) == 0) {
            return {std::get<1>(*res), std::get<2>(*res)};
        }
    }
    return {0.0, 0};
}